

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.cpp
# Opt level: O0

bool __thiscall
lzham::elemental_vector::increase_capacity
          (elemental_vector *this,uint min_new_capacity,bool grow_hint,uint element_size,
          object_mover pMover,bool nofail)

{
  bool bVar1;
  uint64 uVar2;
  ulong uVar3;
  void *pvVar4;
  uint in_ECX;
  byte in_DL;
  uint in_ESI;
  long *in_RDI;
  code *in_R8;
  byte in_R9B;
  char buf_1 [256];
  void *new_p_1;
  char buf [256];
  void *new_p;
  size_t actual_size;
  size_t desired_size;
  size_t new_capacity;
  void *in_stack_fffffffffffffd88;
  size_t *in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  size_t *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  void *in_stack_fffffffffffffdc0;
  lzham_malloc_context in_stack_fffffffffffffdc8;
  char local_158 [220];
  uint in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  ulong local_48;
  ulong local_38;
  
  if (*(uint *)((long)in_RDI + 0xc) < in_ESI) {
    local_38 = (ulong)in_ESI;
    if (((in_DL & 1) != 0) && (bVar1 = math::is_power_of_2(local_38), !bVar1)) {
      uVar2 = math::next_pow2(local_38);
      local_38 = uVar2 & 0xffffffff;
    }
    uVar3 = in_ECX * local_38;
    if (in_R8 == (code *)0x0) {
      pvVar4 = lzham_realloc(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                             (bool)in_stack_fffffffffffffdaf);
      if (pvVar4 == (void *)0x0) {
        if ((in_R9B & 1) != 0) {
          return false;
        }
        sprintf_s(local_158,0x100,"vector: lzham_realloc() failed allocating %u bytes",uVar3);
        lzham_fail(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      }
      *in_RDI = (long)pvVar4;
    }
    else {
      pvVar4 = lzham_malloc((lzham_malloc_context)
                            CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                            in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      if (pvVar4 == (void *)0x0) {
        if ((in_R9B & 1) != 0) {
          return false;
        }
        sprintf_s(&stack0xfffffffffffffd98,0x100,"vector: lzham_malloc() failed allocating %u bytes"
                  ,uVar3);
        lzham_fail(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      }
      (*in_R8)(pvVar4,*in_RDI,(int)in_RDI[1]);
      if (*in_RDI != 0) {
        lzham_free(in_RDI,in_stack_fffffffffffffd88);
      }
      *in_RDI = (long)pvVar4;
    }
    if (uVar3 < local_48) {
      *(int *)((long)in_RDI + 0xc) = (int)(local_48 / in_ECX);
    }
    else {
      *(int *)((long)in_RDI + 0xc) = (int)local_38;
    }
  }
  return true;
}

Assistant:

bool elemental_vector::increase_capacity(uint min_new_capacity, bool grow_hint, uint element_size, object_mover pMover, bool nofail)
   {
      LZHAM_ASSERT(m_size <= m_capacity);
      
#if LZHAM_64BIT_POINTERS
      LZHAM_ASSUME(sizeof(void*) == sizeof(uint64));
      LZHAM_ASSERT(min_new_capacity < (0x400000000ULL / element_size));
#else      
      LZHAM_ASSUME(sizeof(void*) == sizeof(uint32));
      LZHAM_ASSERT(min_new_capacity < (0x7FFF0000U / element_size));
#endif      

      if (m_capacity >= min_new_capacity)
         return true;

      // new_capacity must be 64-bit when compiling on x64.
		size_t new_capacity = (size_t)min_new_capacity;
      if ((grow_hint) && (!math::is_power_of_2(static_cast<uint64>(new_capacity))))
         new_capacity = static_cast<uint>(math::next_pow2(static_cast<uint64>(new_capacity)));

      LZHAM_ASSERT(new_capacity && (new_capacity > m_capacity));

      const size_t desired_size = element_size * new_capacity;
      size_t actual_size;
      if (!pMover)
      {
         void* new_p = lzham_realloc(m_malloc_context, m_p, desired_size, &actual_size, true);
         if (!new_p)
         {
            if (nofail)
            {
               LZHAM_LOG_ERROR(5000);
               return false;
            }
               
            char buf[256];
            sprintf_s(buf, sizeof(buf), "vector: lzham_realloc() failed allocating %u bytes", desired_size);
            LZHAM_FAIL(buf);
         }
         m_p = new_p;
      }
      else
      {
         void* new_p = lzham_malloc(m_malloc_context, desired_size, &actual_size);
         if (!new_p)
         {
            if (nofail)
            {
               LZHAM_LOG_ERROR(5001);
               return false;
            }
               
            LZHAM_LOG_ERROR(5002);

            char buf[256];
            sprintf_s(buf, sizeof(buf), "vector: lzham_malloc() failed allocating %u bytes", desired_size);
            LZHAM_FAIL(buf);
         }
         
         (*pMover)(new_p, m_p, m_size);
         
         if (m_p)
            lzham_free(m_malloc_context, m_p);

         m_p = new_p;
      }            
      
      if (actual_size > desired_size)
         m_capacity = static_cast<uint>(actual_size / element_size);
      else
         m_capacity = static_cast<uint>(new_capacity);
    
      return true;
   }